

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Bounds3f * __thiscall
phyr::Transform::operator()(Bounds3f *__return_storage_ptr__,Transform *this,Bounds3f *b)

{
  Point3<double> local_98;
  Point3<double> local_78;
  Bounds3<double> local_60;
  
  local_98.z = (b->pMin).z;
  local_98.x = (b->pMin).x;
  local_98.y = (b->pMin).y;
  operator()(this,&local_98);
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  (__return_storage_ptr__->pMax).x = local_60.pMin.x;
  (__return_storage_ptr__->pMax).y = local_60.pMin.y;
  (__return_storage_ptr__->pMax).z = local_60.pMin.z;
  local_78.x = (b->pMax).x;
  local_78.y = (b->pMin).y;
  local_78.z = (b->pMin).z;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.y = (b->pMax).y;
  local_78.x = (b->pMin).x;
  local_78.z = (b->pMin).z;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.z = (b->pMax).z;
  local_78.x = (b->pMin).x;
  local_78.y = (b->pMin).y;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.x = (b->pMin).x;
  local_78.y = (b->pMax).y;
  local_78.z = (b->pMax).z;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.z = (b->pMin).z;
  local_78.x = (b->pMax).x;
  local_78.y = (b->pMax).y;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.y = (b->pMin).y;
  local_78.x = (b->pMax).x;
  local_78.z = (b->pMax).z;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  local_78.z = (b->pMax).z;
  local_78.x = (b->pMax).x;
  local_78.y = (b->pMax).y;
  operator()(this,&local_78);
  unionBounds<double>(&local_60,__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->pMax).y = local_60.pMax.y;
  (__return_storage_ptr__->pMax).z = local_60.pMax.z;
  (__return_storage_ptr__->pMin).z = local_60.pMin.z;
  (__return_storage_ptr__->pMax).x = local_60.pMax.x;
  (__return_storage_ptr__->pMin).x = local_60.pMin.x;
  (__return_storage_ptr__->pMin).y = local_60.pMin.y;
  return __return_storage_ptr__;
}

Assistant:

inline Bounds3f operator()(const Bounds3f& b) const {
        const Transform &M = *this;
        Bounds3f ret(M(Point3f(b.pMin.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMax.z)));
        return ret;
    }